

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

SNMPPacket * GenerateTestSNMPRequestPacket(void)

{
  SNMPPacket *this;
  snmp_request_id_t RequestId;
  deque<VarBind,_std::allocator<VarBind>_> *this_00;
  shared_ptr<OIDType> local_a8;
  element_type *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  shared_ptr<BER_CONTAINER> local_88;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  VarBind local_68;
  SNMPPacket *local_38;
  
  this = (SNMPPacket *)operator_new(0xd8);
  SNMPPacket::SNMPPacket(this);
  SNMPPacket::setPDUType(this,GetRequestPDU);
  std::__cxx11::string::string((string *)&local_68,"public",(allocator *)&local_a8);
  SNMPPacket::setCommunityString(this,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  RequestId = random();
  SNMPPacket::setRequestID(this,RequestId);
  SNMPPacket::setVersion(this,SNMP_VERSION_1);
  std::make_shared<SortableOIDType,char_const(&)[17]>((char (*) [17])&local_78);
  local_a8.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_78;
  local_a8.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_70._M_pi;
  local_78 = (element_type *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::make_shared<IntegerType,int>((int *)&local_98);
  this_00 = &this->varbindList;
  local_88.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_98;
  local_88.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_90._M_pi;
  local_98 = (element_type *)0x0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  VarBind::VarBind(&local_68,&local_a8,&local_88);
  Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::emplace_back<VarBind>
            ((deque<VarBind,_std::allocator<VarBind>_> *)this_00,&local_68);
  local_38 = this;
  VarBind::~VarBind(&local_68);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_90);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
  std::make_shared<SortableOIDType,char_const(&)[17]>((char (*) [17])&local_78);
  local_a8.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_78;
  local_a8.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_70._M_pi;
  local_78 = (element_type *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::make_shared<OctetType,char_const(&)[9]>((char (*) [9])&local_98);
  local_88.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_98;
  local_88.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_90._M_pi;
  local_98 = (element_type *)0x0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  VarBind::VarBind(&local_68,&local_a8,&local_88);
  Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::emplace_back<VarBind>
            ((deque<VarBind,_std::allocator<VarBind>_> *)this_00,&local_68);
  VarBind::~VarBind(&local_68);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_90);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
  std::make_shared<SortableOIDType,char_const(&)[27]>((char (*) [27])&local_78);
  local_a8.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_78;
  local_a8.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_70._M_pi;
  local_78 = (element_type *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::make_shared<IntegerType,int>((int *)&local_98);
  local_88.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_98;
  local_88.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_90._M_pi;
  local_98 = (element_type *)0x0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  VarBind::VarBind(&local_68,&local_a8,&local_88);
  Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::emplace_back<VarBind>
            ((deque<VarBind,_std::allocator<VarBind>_> *)this_00,&local_68);
  VarBind::~VarBind(&local_68);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_90);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
  std::make_shared<SortableOIDType,char_const(&)[17]>((char (*) [17])&local_78);
  local_a8.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_78;
  local_a8.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_70._M_pi;
  local_78 = (element_type *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::make_shared<IntegerType,int>((int *)&local_98);
  local_88.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_98;
  local_88.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_90._M_pi;
  local_98 = (element_type *)0x0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  VarBind::VarBind(&local_68,&local_a8,&local_88);
  Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::emplace_back<VarBind>
            ((deque<VarBind,_std::allocator<VarBind>_> *)this_00,&local_68);
  VarBind::~VarBind(&local_68);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_90);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
  std::make_shared<SortableOIDType,char_const(&)[17]>((char (*) [17])&local_78);
  local_a8.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_78;
  local_a8.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_70._M_pi;
  local_78 = (element_type *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::make_shared<IntegerType,int>((int *)&local_98);
  local_88.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_98;
  local_88.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_90._M_pi;
  local_98 = (element_type *)0x0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  VarBind::VarBind(&local_68,&local_a8,&local_88);
  Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::emplace_back<VarBind>
            ((deque<VarBind,_std::allocator<VarBind>_> *)this_00,&local_68);
  VarBind::~VarBind(&local_68);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_90);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
  return local_38;
}

Assistant:

static SNMPPacket* GenerateTestSNMPRequestPacket(){
    SNMPPacket* packet = new SNMPPacket();

    packet->setPDUType(GetRequestPDU);
    packet->setCommunityString("public");
    packet->setRequestID(random());
    packet->setVersion(SNMP_VERSION_1);

    packet->varbindList.push_back(VarBind(std::make_shared<SortableOIDType>(".1.3.6.1.4.1.5.1"),                  std::make_shared<IntegerType>(42)));
    packet->varbindList.push_back(VarBind(std::make_shared<SortableOIDType>(".1.3.6.1.4.1.5.2"),                  std::make_shared<OctetType>("test 123")));
    packet->varbindList.push_back(VarBind(std::make_shared<SortableOIDType>(".1.3.6.1.4.1.52420.9999999"),        std::make_shared<IntegerType>(0)));
    packet->varbindList.push_back(VarBind(std::make_shared<SortableOIDType>(".1.3.6.1.4.1.5.3"),                  std::make_shared<IntegerType>(-42)));
    packet->varbindList.push_back(VarBind(std::make_shared<SortableOIDType>(".1.3.6.1.4.1.5.4"),                  std::make_shared<IntegerType>(-420000)));

    return packet;
}